

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::UseFolderProperty(cmGlobalGenerator *this)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmake *this_00;
  cmState *this_01;
  const_reference this_02;
  pointer this_03;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue prop;
  cmGlobalGenerator *this_local;
  
  prop.Value = (string *)this;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"USE_FOLDERS",&local_41);
  local_20 = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    this_local._7_1_ = cmValue::IsOn(&local_20);
  }
  else {
    bVar1 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::empty(&this->Makefiles);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!this->Makefiles.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalGenerator.cxx"
                    ,0xc20,"virtual bool cmGlobalGenerator::UseFolderProperty() const");
    }
    this_02 = std::
              vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
              ::operator[](&this->Makefiles,0);
    this_03 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_02);
    PVar2 = cmMakefile::GetPolicyStatus(this_03,CMP0143,false);
    this_local._7_1_ = PVar2 == NEW;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::UseFolderProperty() const
{
  const cmValue prop =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("USE_FOLDERS");

  // If this property is defined, let the setter turn this on or off.
  if (prop) {
    return prop.IsOn();
  }

  // If CMP0143 is NEW `treat` "USE_FOLDERS" as ON. Otherwise `treat` it as OFF
  assert(!this->Makefiles.empty());
  return (this->Makefiles[0]->GetPolicyStatus(cmPolicies::CMP0143) ==
          cmPolicies::NEW);
}